

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O2

ContentReader * __thiscall dap::ContentReader::operator=(ContentReader *this,ContentReader *rhs)

{
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign1(&this->buf,&rhs->buf);
  std::__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2> *)rhs);
  this->on_invalid_data = rhs->on_invalid_data;
  return this;
}

Assistant:

ContentReader& ContentReader::operator=(ContentReader&& rhs) noexcept {
  buf = std::move(rhs.buf);
  reader = std::move(rhs.reader);
  on_invalid_data = std::move(rhs.on_invalid_data);
  return *this;
}